

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlCharPtrConstWrap(xmlChar *str)

{
  PyObject *ret;
  xmlChar *str_local;
  
  if (str == (xmlChar *)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    str_local = &_Py_NoneStruct;
  }
  else {
    str_local = (xmlChar *)PyUnicode_FromString(str);
  }
  return (PyObject *)str_local;
}

Assistant:

PyObject *
libxml_xmlCharPtrConstWrap(const xmlChar * str)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlCharPtrWrap: str = %s\n", str);
#endif
    if (str == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PY_IMPORT_STRING((char *) str);
    return (ret);
}